

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::callback
          (AsyncCase *this,GLenum source,GLenum type,GLuint id,GLenum severity,string *message)

{
  mapped_type *pmVar1;
  MessageID local_3c;
  ScopedLock local_30;
  ScopedLock lock;
  string *message_local;
  GLenum severity_local;
  GLuint id_local;
  GLenum type_local;
  GLenum source_local;
  AsyncCase *this_local;
  
  lock.m_mutex = (Mutex *)message;
  de::ScopedLock::ScopedLock(&local_30,&this->m_mutex);
  MessageID::MessageID(&local_3c,source,type,id);
  pmVar1 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
           ::operator[](&this->m_counts,&local_3c);
  pmVar1->received = pmVar1->received + 1;
  de::ScopedLock::~ScopedLock(&local_30);
  return;
}

Assistant:

void AsyncCase::callback (GLenum source, GLenum type, GLuint id, GLenum severity, const string& message)
{
	DE_ASSERT(m_useCallbacks);
	DE_UNREF(severity);
	DE_UNREF(message);

	de::ScopedLock lock(m_mutex);

	m_counts[MessageID(source, type, id)].received++;
}